

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayTP.h
# Opt level: O2

int __thiscall L14_4::ArrayTP<int,_5>::operator[](ArrayTP<int,_5> *this,int i)

{
  if ((uint)i < 6) {
    return this->ar[(uint)i];
  }
  std::operator<<((ostream *)&std::cerr,"Error in array limits: ");
}

Assistant:

T ArrayTP<T, n>::operator[](int i) const {
        //  same as previous?
        if(i < 0 || i > n) {
            //  cerr: something link console.error?
            std::cerr << "Error in array limits: " << i << " is out of range\n";
            //  exit: something like process.exit()?
            std::exit(EXIT_FAILURE);
        }
        //  this return an address, I.E a reference
        return ar[i];
    }